

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall TestValueTestcompareObject::runTestCase(TestValueTestcompareObject *this)

{
  ValueTest *this_00;
  Value *x;
  Value *this_01;
  Value *other;
  long in_RDI;
  PredicateContext _minitest_Context_5;
  PredicateContext _minitest_Context_4;
  PredicateContext _minitest_Context_3;
  PredicateContext _minitest_Context_2;
  PredicateContext _minitest_Context_1;
  PredicateContext _minitest_Context;
  Value l2aObject;
  Value l1bObject;
  Value l1aObject;
  Value emptyObject;
  Value *in_stack_fffffffffffffce8;
  Int value;
  Value *in_stack_fffffffffffffcf0;
  char *in_stack_fffffffffffffcf8;
  Value *in_stack_fffffffffffffd00;
  Value *in_stack_fffffffffffffd20;
  undefined4 local_2c8 [2];
  char *local_2c0;
  undefined4 local_2b8;
  char *local_2b0;
  undefined8 local_2a8;
  undefined8 local_2a0;
  Value *in_stack_fffffffffffffd68;
  Value *in_stack_fffffffffffffd70;
  undefined4 local_270 [2];
  char *local_268;
  undefined4 local_260;
  char *local_258;
  undefined8 local_250;
  undefined8 local_248;
  undefined4 local_218 [2];
  char *local_210;
  undefined4 local_208;
  char *local_200;
  undefined8 local_1f8;
  undefined8 local_1f0;
  undefined4 local_1e8 [2];
  char *local_1e0;
  undefined4 local_1d8;
  char *local_1d0;
  undefined8 local_1c8;
  undefined8 local_1c0;
  undefined4 local_1b8 [2];
  char *local_1b0;
  undefined4 local_1a8;
  char *local_1a0;
  undefined8 local_198;
  undefined8 local_190;
  undefined4 local_188 [2];
  char *local_180;
  undefined4 local_178;
  char *local_170;
  undefined8 local_168;
  undefined8 local_160;
  
  Json::Value::Value(in_stack_fffffffffffffd00,(ValueType)((ulong)in_stack_fffffffffffffcf8 >> 0x20)
                    );
  Json::Value::Value(in_stack_fffffffffffffd00,(ValueType)((ulong)in_stack_fffffffffffffcf8 >> 0x20)
                    );
  Json::Value::Value(in_stack_fffffffffffffcf0,(Int)((ulong)in_stack_fffffffffffffce8 >> 0x20));
  this_00 = (ValueTest *)
            Json::Value::operator[](in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
  Json::Value::operator=(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
  Json::Value::~Value(in_stack_fffffffffffffd20);
  Json::Value::Value((Value *)this_00,(ValueType)((ulong)in_stack_fffffffffffffcf8 >> 0x20));
  Json::Value::Value(in_stack_fffffffffffffcf0,(Int)((ulong)in_stack_fffffffffffffce8 >> 0x20));
  x = Json::Value::operator[]((Value *)this_00,in_stack_fffffffffffffcf8);
  Json::Value::operator=(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
  Json::Value::~Value(in_stack_fffffffffffffd20);
  Json::Value::Value((Value *)this_00,(ValueType)((ulong)x >> 0x20));
  Json::Value::Value(in_stack_fffffffffffffcf0,(Int)((ulong)in_stack_fffffffffffffce8 >> 0x20));
  this_01 = Json::Value::operator[]((Value *)this_00,(char *)x);
  Json::Value::operator=(this_01,in_stack_fffffffffffffce8);
  value = (Int)((ulong)in_stack_fffffffffffffce8 >> 0x20);
  Json::Value::~Value(in_stack_fffffffffffffd20);
  Json::Value::Value(this_01,value);
  other = Json::Value::operator[]((Value *)this_00,(char *)x);
  Json::Value::operator=(this_01,other);
  Json::Value::~Value(in_stack_fffffffffffffd20);
  local_188[0] = **(undefined4 **)(in_RDI + 8);
  local_180 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_178 = 0x568;
  local_170 = "checkIsLess(emptyObject, l1aObject)";
  local_168 = 0;
  local_160 = 0;
  *(undefined4 **)(*(long *)(*(long *)(in_RDI + 8) + 8) + 0x20) = local_188;
  **(int **)(in_RDI + 8) = **(int **)(in_RDI + 8) + 1;
  *(undefined4 **)(*(long *)(in_RDI + 8) + 8) = local_188;
  ValueTest::checkIsLess(this_00,x,this_01);
  JsonTest::TestResult::popPredicateContext(*(TestResult **)(in_RDI + 8));
  local_1b8[0] = **(undefined4 **)(in_RDI + 8);
  local_1b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_1a8 = 0x569;
  local_1a0 = "checkIsLess(emptyObject, l2aObject)";
  local_198 = 0;
  local_190 = 0;
  *(undefined4 **)(*(long *)(*(long *)(in_RDI + 8) + 8) + 0x20) = local_1b8;
  **(int **)(in_RDI + 8) = **(int **)(in_RDI + 8) + 1;
  *(undefined4 **)(*(long *)(in_RDI + 8) + 8) = local_1b8;
  ValueTest::checkIsLess(this_00,x,this_01);
  JsonTest::TestResult::popPredicateContext(*(TestResult **)(in_RDI + 8));
  local_1e8[0] = **(undefined4 **)(in_RDI + 8);
  local_1e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_1d8 = 0x56a;
  local_1d0 = "checkIsLess(l1aObject, l2aObject)";
  local_1c8 = 0;
  local_1c0 = 0;
  *(undefined4 **)(*(long *)(*(long *)(in_RDI + 8) + 8) + 0x20) = local_1e8;
  **(int **)(in_RDI + 8) = **(int **)(in_RDI + 8) + 1;
  *(undefined4 **)(*(long *)(in_RDI + 8) + 8) = local_1e8;
  ValueTest::checkIsLess(this_00,x,this_01);
  JsonTest::TestResult::popPredicateContext(*(TestResult **)(in_RDI + 8));
  local_218[0] = **(undefined4 **)(in_RDI + 8);
  local_210 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_208 = 0x56b;
  local_200 = "checkIsEqual(emptyObject, Json::Value(emptyObject))";
  local_1f8 = 0;
  local_1f0 = 0;
  *(undefined4 **)(*(long *)(*(long *)(in_RDI + 8) + 8) + 0x20) = local_218;
  **(int **)(in_RDI + 8) = **(int **)(in_RDI + 8) + 1;
  *(undefined4 **)(*(long *)(in_RDI + 8) + 8) = local_218;
  Json::Value::Value(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  ValueTest::checkIsEqual(this_00,x,this_01);
  Json::Value::~Value(in_stack_fffffffffffffd20);
  JsonTest::TestResult::popPredicateContext(*(TestResult **)(in_RDI + 8));
  local_270[0] = **(undefined4 **)(in_RDI + 8);
  local_268 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_260 = 0x56c;
  local_258 = "checkIsEqual(l1aObject, Json::Value(l1aObject))";
  local_250 = 0;
  local_248 = 0;
  *(undefined4 **)(*(long *)(*(long *)(in_RDI + 8) + 8) + 0x20) = local_270;
  **(int **)(in_RDI + 8) = **(int **)(in_RDI + 8) + 1;
  *(undefined4 **)(*(long *)(in_RDI + 8) + 8) = local_270;
  Json::Value::Value(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  ValueTest::checkIsEqual(this_00,x,this_01);
  Json::Value::~Value(in_stack_fffffffffffffd20);
  JsonTest::TestResult::popPredicateContext(*(TestResult **)(in_RDI + 8));
  local_2c8[0] = **(undefined4 **)(in_RDI + 8);
  local_2c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_2b8 = 0x56d;
  local_2b0 = "checkIsEqual(l2aObject, Json::Value(l2aObject))";
  local_2a8 = 0;
  local_2a0 = 0;
  *(undefined4 **)(*(long *)(*(long *)(in_RDI + 8) + 8) + 0x20) = local_2c8;
  **(int **)(in_RDI + 8) = **(int **)(in_RDI + 8) + 1;
  *(undefined4 **)(*(long *)(in_RDI + 8) + 8) = local_2c8;
  Json::Value::Value(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  ValueTest::checkIsEqual(this_00,x,this_01);
  Json::Value::~Value(in_stack_fffffffffffffd20);
  JsonTest::TestResult::popPredicateContext(*(TestResult **)(in_RDI + 8));
  Json::Value::~Value(in_stack_fffffffffffffd20);
  Json::Value::~Value(in_stack_fffffffffffffd20);
  Json::Value::~Value(in_stack_fffffffffffffd20);
  Json::Value::~Value(in_stack_fffffffffffffd20);
  return;
}

Assistant:

JSONTEST_FIXTURE(ValueTest, compareObject) {
  // object compare size then content
  Json::Value emptyObject(Json::objectValue);
  Json::Value l1aObject;
  l1aObject["key1"] = 0;
  Json::Value l1bObject;
  l1aObject["key1"] = 10;
  Json::Value l2aObject;
  l2aObject["key1"] = 0;
  l2aObject["key2"] = 0;
  JSONTEST_ASSERT_PRED(checkIsLess(emptyObject, l1aObject));
  JSONTEST_ASSERT_PRED(checkIsLess(emptyObject, l2aObject));
  JSONTEST_ASSERT_PRED(checkIsLess(l1aObject, l2aObject));
  JSONTEST_ASSERT_PRED(checkIsEqual(emptyObject, Json::Value(emptyObject)));
  JSONTEST_ASSERT_PRED(checkIsEqual(l1aObject, Json::Value(l1aObject)));
  JSONTEST_ASSERT_PRED(checkIsEqual(l2aObject, Json::Value(l2aObject)));
}